

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateFastCmEqLikely(Lowerer *this,Instr *instr,bool *pNeedHelper,bool isInHelper)

{
  int iVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  OpCode branchOpCode;
  uint uVar5;
  int iVar6;
  LibraryValue valueType;
  LabelInstr *pLVar7;
  LabelInstr *branchTarget;
  LabelInstr *labelHelper;
  Opnd *pOVar8;
  BranchInstr *pBVar9;
  undefined4 *puVar10;
  Lowerer *this_00;
  bool bVar11;
  byte local_38;
  
  *pNeedHelper = false;
  uVar5 = instr->m_opcode - 0x3b;
  if ((7 < uVar5) || ((0xe1U >> (uVar5 & 0x1f) & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                        ,0x5e60,
                        "(instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A)"
                        ,
                        "instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A"
                       );
    if (!bVar11) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
  }
  iVar1 = *(int *)&instr->m_opcode;
  iVar6 = iVar1 + -0x40;
  bVar11 = 2 < (ushort)iVar6;
  branchOpCode = BrEq_A;
  if (!bVar11) {
    branchOpCode = (OpCode)(0x140014000c >> ((char)iVar6 * '\x10' & 0x3fU));
  }
  pOVar2 = instr->m_src1;
  pOVar8 = instr->m_src2;
  pLVar7 = IR::LabelInstr::New(Label,this->m_func,isInHelper);
  branchTarget = IR::LabelInstr::New(Label,this->m_func,isInHelper);
  labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
  bVar4 = GenerateFastBooleanAndObjectEqLikely
                    (this,instr,pOVar2,pOVar8,labelHelper,pLVar7,pNeedHelper,isInHelper);
  if (bVar4) {
    local_38 = (byte)iVar1;
    IR::Instr::InsertBefore(instr,&pLVar7->super_Instr);
    uVar5 = (bVar11 | local_38) & 1;
    valueType = ValueFalse - uVar5;
    bVar11 = IR::Opnd::IsEqual(pOVar2,pOVar8);
    if (bVar11) {
      pOVar2 = instr->m_dst;
      pOVar8 = LoadLibraryValueOpnd(this,instr,valueType);
      InsertMove(pOVar2,pOVar8,instr,true);
    }
    else {
      this_00 = (Lowerer *)0x176;
      pLVar7 = IR::LabelInstr::New(Label,this->m_func,isInHelper);
      InsertCompareBranch(this_00,pOVar2,pOVar8,branchOpCode,false,pLVar7,instr,false);
      pOVar2 = instr->m_dst;
      pOVar8 = LoadLibraryValueOpnd(this,instr,uVar5 + ValueTrue);
      InsertMove(pOVar2,pOVar8,instr,true);
      pBVar9 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
      IR::Instr::InsertBefore(instr,&pBVar9->super_Instr);
      IR::Instr::InsertBefore(instr,&pLVar7->super_Instr);
      pOVar2 = instr->m_dst;
      pOVar8 = LoadLibraryValueOpnd(this,instr,valueType);
      InsertMove(pOVar2,pOVar8,instr,true);
    }
    pBVar9 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
    IR::Instr::InsertBefore(instr,&pBVar9->super_Instr);
    IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
    IR::Instr::InsertAfter(instr,&branchTarget->super_Instr);
  }
  return bVar4;
}

Assistant:

bool Lowerer::GenerateFastCmEqLikely(IR::Instr * instr, bool *pNeedHelper, bool isInHelper)
{
    *pNeedHelper = false;

    Assert(instr->m_opcode == Js::OpCode::CmSrEq_A ||
        instr->m_opcode == Js::OpCode::CmSrNeq_A   ||
        instr->m_opcode == Js::OpCode::CmEq_A      ||
        instr->m_opcode == Js::OpCode::CmNeq_A);

    bool isNegOp = false;
    bool isStrict = false;
    switch (instr->m_opcode)
    {
    case Js::OpCode::CmSrEq_A:
        isStrict = true;
        break;

    case Js::OpCode::CmSrNeq_A:
        isStrict = true;
    case Js::OpCode::CmNeq_A:
        isNegOp = true;
        break;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    IR::LabelInstr *labelEqualLikely = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);
    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);
    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (!this->GenerateFastBooleanAndObjectEqLikely(instr, src1, src2, labelHelper, labelEqualLikely, pNeedHelper, isInHelper))
    {
        return false;
    }

    instr->InsertBefore(labelEqualLikely);

    // $labelEqualLikely
    //
    // Will only come here for
    //   if src2 is dynamic object(matches Js::DynamicObject::`vtable'), for non strict cm both src1 and src2 should be dynamic object
    //   or if src2 is builtin recyclableobject(typeId > TypeIds_LastStaticType && typeId <= TypeIds_LastBuiltinDynamicObject)
    //   or if CustomExternalType with no operations usage flags
    //
    //  src1->IsEqual(src2)
    //      MOV DST SUCCESS
    //      JMP $DONE
    //  CMP src1, src2
    //      MOV DST SUCCESS
    //      JEQ $DONE
    //      MOV DST FAILURE
    //      JMP $DONE

    LibraryValue successValueType = !isNegOp ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
    LibraryValue failureValueType = !isNegOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;

    if (src1->IsEqual(src2))
    {
        Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, successValueType), instr);
        instr->InsertBefore(IR::BranchInstr::New(this->m_lowererMD.MDUncondBranchOpcode, labelDone, this->m_func));
    }
    else
    {
        IR::LabelInstr *cmEqual = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);
        this->InsertCompareBranch(src1, src2, isStrict ? Js::OpCode::BrSrEq_A : Js::OpCode::BrEq_A, cmEqual, instr);
        Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, failureValueType), instr);

        instr->InsertBefore(IR::BranchInstr::New(this->m_lowererMD.MDUncondBranchOpcode, labelDone, this->m_func));

        instr->InsertBefore(cmEqual);
        Lowerer::InsertMove(instr->GetDst(), this->LoadLibraryValueOpnd(instr, successValueType), instr);

        instr->InsertBefore(IR::BranchInstr::New(this->m_lowererMD.MDUncondBranchOpcode, labelDone, this->m_func));
    }

    instr->InsertBefore(labelHelper);
    instr->InsertAfter(labelDone);

    return true;
}